

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.cc
# Opt level: O1

void __thiscall
leveldb::Block::Iter::Iter
          (Iter *this,Comparator *comparator,char *data,uint32_t restarts,uint32_t num_restarts)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  Iterator::Iterator(&this->super_Iterator);
  (this->super_Iterator)._vptr_Iterator = (_func_int **)&PTR__Iter_00b3f218;
  this->comparator_ = comparator;
  this->data_ = data;
  this->restarts_ = restarts;
  this->num_restarts_ = num_restarts;
  this->current_ = restarts;
  this->restart_index_ = num_restarts;
  (this->key_)._M_dataplus._M_p = (pointer)&(this->key_).field_2;
  (this->key_)._M_string_length = 0;
  (this->key_).field_2._M_local_buf[0] = '\0';
  (this->value_).data_ = "";
  (this->value_).size_ = 0;
  (this->status_).state_ = (char *)0x0;
  if (num_restarts == 0) {
    __assert_fail("num_restarts_ > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/table/block.cc"
                  ,0x7c,
                  "leveldb::Block::Iter::Iter(const Comparator *, const char *, uint32_t, uint32_t)"
                 );
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Iter(const Comparator* comparator, const char* data, uint32_t restarts,
       uint32_t num_restarts)
      : comparator_(comparator),
        data_(data),
        restarts_(restarts),
        num_restarts_(num_restarts),
        current_(restarts_),
        restart_index_(num_restarts_) {
    assert(num_restarts_ > 0);
  }